

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::SpreadVolatileSemantics::IsTargetForVolatileSemantics
          (SpreadVolatileSemantics *this,uint32_t var_id,ExecutionModel execution_model)

{
  bool bVar1;
  uint32_t uVar2;
  IRContext *this_00;
  DecorationManager *decoration_manager_00;
  Module *this_01;
  bool local_31;
  DecorationManager *decoration_manager;
  ExecutionModel execution_model_local;
  uint32_t var_id_local;
  SpreadVolatileSemantics *this_local;
  
  this_00 = Pass::context(&this->super_Pass);
  decoration_manager_00 = IRContext::get_decoration_mgr(this_00);
  if (execution_model == Fragment) {
    this_01 = Pass::get_module(&this->super_Pass);
    uVar2 = Module::version(this_01);
    local_31 = false;
    if (0x105ff < uVar2) {
      local_31 = anon_unknown_0::HasBuiltinDecoration(decoration_manager_00,var_id,0x17);
    }
    this_local._7_1_ = local_31;
  }
  else if (((execution_model == IntersectionKHR) || (execution_model == IntersectionKHR)) &&
          (bVar1 = anon_unknown_0::HasBuiltinDecoration(decoration_manager_00,var_id,0x14ce), bVar1)
          ) {
    this_local._7_1_ = true;
  }
  else if ((execution_model - RayGenerationKHR < 2) || (execution_model - ClosestHitKHR < 3)) {
    this_local._7_1_ =
         anon_unknown_0::HasBuiltinForRayTracingVolatileSemantics(decoration_manager_00,var_id);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SpreadVolatileSemantics::IsTargetForVolatileSemantics(
    uint32_t var_id, spv::ExecutionModel execution_model) {
  analysis::DecorationManager* decoration_manager =
      context()->get_decoration_mgr();
  if (execution_model == spv::ExecutionModel::Fragment) {
    return get_module()->version() >= SPV_SPIRV_VERSION_WORD(1, 6) &&
           HasBuiltinDecoration(decoration_manager, var_id,
                                uint32_t(spv::BuiltIn::HelperInvocation));
  }

  if (execution_model == spv::ExecutionModel::IntersectionKHR ||
      execution_model == spv::ExecutionModel::IntersectionNV) {
    if (HasBuiltinDecoration(decoration_manager, var_id,
                             uint32_t(spv::BuiltIn::RayTmaxKHR))) {
      return true;
    }
  }

  switch (execution_model) {
    case spv::ExecutionModel::RayGenerationKHR:
    case spv::ExecutionModel::ClosestHitKHR:
    case spv::ExecutionModel::MissKHR:
    case spv::ExecutionModel::CallableKHR:
    case spv::ExecutionModel::IntersectionKHR:
      return HasBuiltinForRayTracingVolatileSemantics(decoration_manager,
                                                      var_id);
    default:
      return false;
  }
}